

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dchSim.c
# Opt level: O1

int Dch_NodeIsConst(void *p,Aig_Obj_t *pObj)

{
  long *plVar1;
  uint uVar2;
  ulong uVar3;
  
  if ((1 < (int)*(uint *)((long)p + 4)) && ((uint)pObj->Id < *(uint *)((long)p + 4))) {
    plVar1 = *(long **)((long)p + 8);
    uVar2 = (uint)((ulong)(plVar1[1] - *plVar1) >> 2);
    if ((pObj->field_0x18 & 8) == 0) {
      if (0 < (int)uVar2) {
        uVar3 = 0;
        do {
          if (*(int *)(plVar1[(uint)pObj->Id] + uVar3 * 4) != 0) {
            return 0;
          }
          uVar3 = uVar3 + 1;
        } while ((uVar2 & 0x7fffffff) != uVar3);
      }
    }
    else if (0 < (int)uVar2) {
      uVar3 = 0;
      do {
        if (*(int *)(plVar1[(uint)pObj->Id] + uVar3 * 4) != -1) {
          return 0;
        }
        uVar3 = uVar3 + 1;
      } while ((uVar2 & 0x7fffffff) != uVar3);
    }
    return 1;
  }
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecPtr.h"
                ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
}

Assistant:

int Dch_NodeIsConst( void * p, Aig_Obj_t * pObj )
{
    Vec_Ptr_t * vSims = (Vec_Ptr_t *)p;
    unsigned * pSim;
    int k, nWords;
    nWords = (unsigned *)Vec_PtrEntry(vSims, 1) - (unsigned *)Vec_PtrEntry(vSims, 0);
    pSim  = Dch_ObjSim( vSims, pObj );
    if ( pObj->fPhase )
    {
        for ( k = 0; k < nWords; k++ )
            if ( ~pSim[k] )
                return 0;
    }
    else
    {
        for ( k = 0; k < nWords; k++ )
            if ( pSim[k] )
                return 0;
    }
    return 1;
}